

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistry.cpp
# Opt level: O0

void __thiscall TestRegistry::listTestLocations(TestRegistry *this,TestResult *result)

{
  size_t sVar1;
  char *pcVar2;
  SimpleString local_90;
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined1 local_60 [40];
  SimpleString testLocation;
  UtestShell *test;
  SimpleString testLocations;
  TestResult *result_local;
  TestRegistry *this_local;
  
  testLocations.bufferSize_ = (size_t)result;
  SimpleString::SimpleString((SimpleString *)&test,"");
  for (testLocation.bufferSize_ = (size_t)this->tests_; sVar1 = testLocations.bufferSize_,
      testLocation.bufferSize_ != 0;
      testLocation.bufferSize_ = (**(code **)(*(long *)testLocation.bufferSize_ + 0x18))()) {
    SimpleString::SimpleString((SimpleString *)(local_60 + 0x20),"");
    UtestShell::getGroup((UtestShell *)local_60);
    SimpleString::operator+=((SimpleString *)(local_60 + 0x20),(SimpleString *)local_60);
    SimpleString::~SimpleString((SimpleString *)local_60);
    SimpleString::operator+=((SimpleString *)(local_60 + 0x20),".");
    UtestShell::getName((UtestShell *)local_70);
    SimpleString::operator+=((SimpleString *)(local_60 + 0x20),(SimpleString *)local_70);
    SimpleString::~SimpleString((SimpleString *)local_70);
    SimpleString::operator+=((SimpleString *)(local_60 + 0x20),".");
    UtestShell::getFile((UtestShell *)local_80);
    SimpleString::operator+=((SimpleString *)(local_60 + 0x20),(SimpleString *)local_80);
    SimpleString::~SimpleString((SimpleString *)local_80);
    SimpleString::operator+=((SimpleString *)(local_60 + 0x20),".");
    sVar1 = UtestShell::getLineNumber((UtestShell *)testLocation.bufferSize_);
    StringFromFormat((char *)&local_90,"%d\n",sVar1 & 0xffffffff);
    SimpleString::operator+=((SimpleString *)(local_60 + 0x20),&local_90);
    SimpleString::~SimpleString(&local_90);
    SimpleString::operator+=((SimpleString *)&test,(SimpleString *)(local_60 + 0x20));
    SimpleString::~SimpleString((SimpleString *)(local_60 + 0x20));
  }
  pcVar2 = SimpleString::asCharString((SimpleString *)&test);
  (**(code **)(*(long *)sVar1 + 0x70))(sVar1,pcVar2);
  SimpleString::~SimpleString((SimpleString *)&test);
  return;
}

Assistant:

void TestRegistry::listTestLocations(TestResult& result)
{
    SimpleString testLocations;

    for (UtestShell *test = tests_; test != NULLPTR; test = test->getNext()) {
            SimpleString testLocation;
            testLocation += test->getGroup();
            testLocation += ".";
            testLocation += test->getName();
            testLocation += ".";
            testLocation += test->getFile();
            testLocation += ".";
            testLocation += StringFromFormat("%d\n",(int) test->getLineNumber());

            testLocations += testLocation;
    }

    result.print(testLocations.asCharString());
}